

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O2

void __thiscall
asio::detail::
write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::write_op<asio::const_buffers_1>,_asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>_>_>
::operator()(write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::write_op<asio::const_buffers_1>,_asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>_>_>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  ulong bytes_transferred_00;
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  const_buffers_1 local_10;
  
  this->start_ = start;
  iVar2 = ec._M_value;
  if (start == 1) {
    uVar1 = (ulong)(iVar2 == 0) << 0x10;
    sVar3 = (this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
            super_const_buffer.size_;
    bytes_transferred_00 =
         (this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_;
  }
  else {
    sVar3 = (this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
            super_const_buffer.size_;
    bytes_transferred_00 =
         (this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_ +
         bytes_transferred;
    (this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_ =
         bytes_transferred_00;
    if ((sVar3 <= bytes_transferred_00 || iVar2 == 0 && bytes_transferred == 0) || iVar2 != 0) {
      asio::ssl::detail::
      io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::write_op<asio::const_buffers_1>,_asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>_>
      ::operator()(&this->handler_,ec,bytes_transferred_00,0);
      return;
    }
    uVar1 = 0x10000;
  }
  if (sVar3 < bytes_transferred_00) {
    bytes_transferred_00 = sVar3;
  }
  local_10.super_const_buffer.data_ =
       (void *)(bytes_transferred_00 +
               (long)(this->buffers_).super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
                     super_const_buffer.data_);
  local_10.super_const_buffer.size_ = sVar3 - bytes_transferred_00;
  if (uVar1 <= sVar3 - bytes_transferred_00) {
    local_10.super_const_buffer.size_ = uVar1;
  }
  basic_stream_socket<asio::ip::tcp,asio::any_io_executor>::
  async_write_some<asio::const_buffers_1,asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::write_op<asio::const_buffers_1>,asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>>>>>
            ((basic_stream_socket<asio::ip::tcp,asio::any_io_executor> *)this->stream_,&local_10,
             this);
  return;
}

Assistant:

void operator()(asio::error_code ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, buffers_.total_consumed());
        for (;;)
        {
          {
            ASIO_HANDLER_LOCATION((__FILE__, __LINE__, "async_write"));
            stream_.async_write_some(buffers_.prepare(max_size),
                ASIO_MOVE_CAST(write_op)(*this));
          }
          return; default:
          buffers_.consume(bytes_transferred);
          if ((!ec && bytes_transferred == 0) || buffers_.empty())
            break;
          max_size = this->check_for_completion(ec, buffers_.total_consumed());
          if (max_size == 0)
            break;
          if (this->cancelled() != cancellation_type::none)
          {
            ec = error::operation_aborted;
            break;
          }
        }

        ASIO_MOVE_OR_LVALUE(WriteHandler)(handler_)(
            static_cast<const asio::error_code&>(ec),
            static_cast<const std::size_t&>(buffers_.total_consumed()));
      }
    }